

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void updateAccumulator(Parse *pParse,AggInfo *pAggInfo)

{
  Vdbe *v;
  ExprList *pList;
  FuncDef *p;
  int *piVar1;
  bool bVar2;
  int iVar3;
  CollSeq *zP4;
  Op *pOVar4;
  AggInfo_func *pAVar5;
  Expr **ppEVar6;
  int nReg;
  int iVar7;
  ExprList_item *pEVar8;
  bool bVar9;
  int local_58;
  int local_54;
  int local_50;
  uint local_4c;
  
  v = pParse->pVdbe;
  pAggInfo->directMode = '\x01';
  local_50 = 0;
  local_58 = 0;
  if (0 < pAggInfo->nFunc) {
    pAVar5 = pAggInfo->aFunc;
    iVar7 = 0;
    local_58 = 0;
    do {
      pList = (pAVar5->pExpr->x).pList;
      nReg = 0;
      local_54 = 0;
      if (pList != (ExprList *)0x0) {
        nReg = pList->nExpr;
        local_54 = sqlite3GetTempRange(pParse,nReg);
        sqlite3ExprCodeExprList(pParse,pList,local_54,0,'\x01');
      }
      if (pAVar5->iDistinct < 0) {
        local_4c = 0;
      }
      else {
        local_4c = sqlite3VdbeMakeLabel(v);
        codeDistinct(pParse,pAVar5->iDistinct,local_4c,1,local_54);
      }
      if ((pAVar5->pFunc->funcFlags & 0x20) != 0) {
        if (nReg < 1) {
          bVar9 = true;
          zP4 = (CollSeq *)0x0;
        }
        else {
          pEVar8 = pList->a;
          iVar3 = 1;
          do {
            zP4 = sqlite3ExprCollSeq(pParse,pEVar8->pExpr);
            bVar9 = zP4 == (CollSeq *)0x0;
            if (!bVar9) break;
            pEVar8 = pEVar8 + 1;
            bVar2 = iVar3 < nReg;
            iVar3 = iVar3 + 1;
          } while (bVar2);
        }
        if (bVar9) {
          zP4 = pParse->db->pDfltColl;
        }
        if (local_58 == 0) {
          if (pAggInfo->nAccumulator == 0) {
            local_58 = 0;
          }
          else {
            local_58 = pParse->nMem + 1;
            pParse->nMem = local_58;
          }
        }
        iVar3 = sqlite3VdbeAddOp3(v,0x44,local_58,0,0);
        sqlite3VdbeChangeP4(v,iVar3,(char *)zP4,-2);
      }
      sqlite3VdbeAddOp3(v,0x94,0,local_54,pAVar5->iMem);
      p = pAVar5->pFunc;
      if (v->db->mallocFailed == '\0') {
        pOVar4 = v->aOp;
        iVar3 = v->nOp;
        pOVar4[(long)iVar3 + -1].p4type = -8;
        pOVar4[(long)iVar3 + -1].p4.p = p;
      }
      else if ((p->funcFlags & 0x10) != 0) {
        sqlite3DbFreeNN(v->db,p);
      }
      if (0 < (long)v->nOp) {
        v->aOp[(long)v->nOp + -1].p5 = (ushort)nReg & 0xff;
      }
      sqlite3ExprCacheRemove(pParse,local_54,nReg);
      sqlite3ReleaseTempRange(pParse,local_54,nReg);
      if (local_4c != 0) {
        piVar1 = v->pParse->aLabel;
        if (piVar1 != (int *)0x0) {
          piVar1[(int)~local_4c] = v->nOp;
        }
        sqlite3ExprCacheClear(pParse);
      }
      iVar7 = iVar7 + 1;
      pAVar5 = pAVar5 + 1;
    } while (iVar7 < pAggInfo->nFunc);
  }
  if (local_58 != 0) {
    local_50 = sqlite3VdbeAddOp3(v,0x15,local_58,0,0);
  }
  sqlite3ExprCacheClear(pParse);
  if (0 < pAggInfo->nAccumulator) {
    ppEVar6 = &pAggInfo->aCol->pExpr;
    iVar7 = 0;
    do {
      sqlite3ExprCode(pParse,*ppEVar6,*(int *)((long)ppEVar6 + -4));
      iVar7 = iVar7 + 1;
      ppEVar6 = ppEVar6 + 4;
    } while (iVar7 < pAggInfo->nAccumulator);
  }
  pAggInfo->directMode = '\0';
  sqlite3ExprCacheClear(pParse);
  if (local_50 != 0) {
    if (v->db->mallocFailed == '\0') {
      iVar7 = v->nOp + -1;
      if (-1 < local_50) {
        iVar7 = local_50;
      }
      pOVar4 = v->aOp + iVar7;
    }
    else {
      pOVar4 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar4->p2 = v->nOp;
  }
  return;
}

Assistant:

static void updateAccumulator(Parse *pParse, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  int regHit = 0;
  int addrHitTest = 0;
  struct AggInfo_func *pF;
  struct AggInfo_col *pC;

  pAggInfo->directMode = 1;
  for(i=0, pF=pAggInfo->aFunc; i<pAggInfo->nFunc; i++, pF++){
    int nArg;
    int addrNext = 0;
    int regAgg;
    ExprList *pList = pF->pExpr->x.pList;
    assert( !ExprHasProperty(pF->pExpr, EP_xIsSelect) );
    if( pList ){
      nArg = pList->nExpr;
      regAgg = sqlite3GetTempRange(pParse, nArg);
      sqlite3ExprCodeExprList(pParse, pList, regAgg, 0, SQLITE_ECEL_DUP);
    }else{
      nArg = 0;
      regAgg = 0;
    }
    if( pF->iDistinct>=0 ){
      addrNext = sqlite3VdbeMakeLabel(v);
      testcase( nArg==0 );  /* Error condition */
      testcase( nArg>1 );   /* Also an error */
      codeDistinct(pParse, pF->iDistinct, addrNext, 1, regAgg);
    }
    if( pF->pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL ){
      CollSeq *pColl = 0;
      struct ExprList_item *pItem;
      int j;
      assert( pList!=0 );  /* pList!=0 if pF->pFunc has NEEDCOLL */
      for(j=0, pItem=pList->a; !pColl && j<nArg; j++, pItem++){
        pColl = sqlite3ExprCollSeq(pParse, pItem->pExpr);
      }
      if( !pColl ){
        pColl = pParse->db->pDfltColl;
      }
      if( regHit==0 && pAggInfo->nAccumulator ) regHit = ++pParse->nMem;
      sqlite3VdbeAddOp4(v, OP_CollSeq, regHit, 0, 0, (char *)pColl, P4_COLLSEQ);
    }
    sqlite3VdbeAddOp3(v, OP_AggStep0, 0, regAgg, pF->iMem);
    sqlite3VdbeAppendP4(v, pF->pFunc, P4_FUNCDEF);
    sqlite3VdbeChangeP5(v, (u8)nArg);
    sqlite3ExprCacheAffinityChange(pParse, regAgg, nArg);
    sqlite3ReleaseTempRange(pParse, regAgg, nArg);
    if( addrNext ){
      sqlite3VdbeResolveLabel(v, addrNext);
      sqlite3ExprCacheClear(pParse);
    }
  }

  /* Before populating the accumulator registers, clear the column cache.
  ** Otherwise, if any of the required column values are already present 
  ** in registers, sqlite3ExprCode() may use OP_SCopy to copy the value
  ** to pC->iMem. But by the time the value is used, the original register
  ** may have been used, invalidating the underlying buffer holding the
  ** text or blob value. See ticket [883034dcb5].
  **
  ** Another solution would be to change the OP_SCopy used to copy cached
  ** values to an OP_Copy.
  */
  if( regHit ){
    addrHitTest = sqlite3VdbeAddOp1(v, OP_If, regHit); VdbeCoverage(v);
  }
  sqlite3ExprCacheClear(pParse);
  for(i=0, pC=pAggInfo->aCol; i<pAggInfo->nAccumulator; i++, pC++){
    sqlite3ExprCode(pParse, pC->pExpr, pC->iMem);
  }
  pAggInfo->directMode = 0;
  sqlite3ExprCacheClear(pParse);
  if( addrHitTest ){
    sqlite3VdbeJumpHere(v, addrHitTest);
  }
}